

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O1

void __thiscall chrono::ChLinkLock::ConstraintsBiLoad_Ct(ChLinkLock *this,double factor)

{
  undefined1 auVar1 [16];
  pointer ppCVar2;
  ChConstraintTwoBodies *pCVar3;
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  int iVar7;
  undefined8 in_XMM0_Qb;
  undefined1 auVar8 [16];
  
  lVar5 = (long)(this->mask).super_ChLinkMask.nconstr;
  if (0 < lVar5) {
    ppCVar2 = (this->mask).super_ChLinkMask.constraints.
              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = 0;
    iVar7 = 0;
    do {
      if ((this->mask).super_ChLinkMask.nconstr <= lVar6) {
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      pCVar3 = ppCVar2[lVar6];
      if ((pCVar3->super_ChConstraintTwo).super_ChConstraint.active == true) {
        if ((iVar7 < 0) ||
           ((this->Ct).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
            m_rows <= (long)iVar7)) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 7, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 7, 1>, Level = 1]"
                       );
        }
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (this->Ct).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.
                       m_storage.m_data.array[iVar7];
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (pCVar3->super_ChConstraintTwo).super_ChConstraint.b_i;
        auVar4._8_8_ = in_XMM0_Qb;
        auVar4._0_8_ = factor;
        auVar1 = vfmadd213sd_fma(auVar8,auVar4,auVar1);
        (pCVar3->super_ChConstraintTwo).super_ChConstraint.b_i = auVar1._0_8_;
        iVar7 = iVar7 + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  return;
}

Assistant:

void ChLinkLock::ConstraintsBiLoad_Ct(double factor) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            mask.Constr_N(i).Set_b_i(mask.Constr_N(i).Get_b_i() + factor * Ct(cnt));
            cnt++;
        }
    }
}